

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_PackageSource
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  pointer *this_00;
  char *__s;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pcVar3;
  string *psVar4;
  allocator<char> local_229;
  value_type local_228;
  allocator<char> local_201;
  value_type local_200;
  undefined1 local_1e0 [8];
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  const_iterator local_d8;
  char **target;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string configFile;
  value_type *mf;
  char *packageSourceTargetName;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  iVar2 = (*this->_vptr_cmGlobalGenerator[0x20])();
  if ((char *)CONCAT44(extraout_var,iVar2) != (char *)0x0) {
    configFile.field_2._8_8_ =
         std::
         vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
         ::operator[](&this->Makefiles,0);
    pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                        configFile.field_2._8_8_);
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
    cmAlphaNum::cmAlphaNum(&local_78,psVar4);
    cmAlphaNum::cmAlphaNum(&local_a8,"/CPackSourceConfig.cmake");
    cmStrCat<>((string *)local_48,&local_78,&local_a8);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_48);
    if (bVar1) {
      __begin1 = (const_iterator)&AddGlobalTarget_PackageSource::reservedTargets;
      __end1 = std::initializer_list<const_char_*>::begin
                         (&AddGlobalTarget_PackageSource::reservedTargets);
      target = std::initializer_list<const_char_*>::end
                         (&AddGlobalTarget_PackageSource::reservedTargets);
      for (; __end1 != target; __end1 = __end1 + 1) {
        local_d8 = __end1;
        __s = *__end1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,__s,&local_f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"when CPack source packaging is enabled",
                   (allocator<char> *)&gti.field_0x9f);
        bVar1 = CheckCMP0037(this,&local_f8,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&gti.field_0x9f);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          __range1._0_4_ = 1;
          goto LAB_006142cb;
        }
      }
      this_00 = &singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      GlobalTargetInfo::GlobalTargetInfo((GlobalTargetInfo *)this_00);
      std::__cxx11::string::operator=((string *)this_00,(char *)CONCAT44(extraout_var,iVar2));
      std::__cxx11::string::operator=
                ((string *)(gti.Name.field_2._M_local_buf + 8),
                 "Run CPack packaging tool for source...");
      pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                         ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                          configFile.field_2._8_8_);
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
      std::__cxx11::string::operator=
                ((string *)
                 &gti.Depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar4);
      gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
      cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_1e0);
      psVar4 = cmSystemTools::GetCPackCommand_abi_cxx11_();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0,psVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"--config",&local_201)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"./CPackSourceConfig.cmake",&local_229);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0,(value_type *)local_48);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 ((long)&gti.Message.field_2 + 8),(value_type *)local_1e0);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(targets,(value_type *)
                          &singleLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_1e0);
      GlobalTargetInfo::~GlobalTargetInfo
                ((GlobalTargetInfo *)
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __range1._0_4_ = 0;
    }
    else {
      __range1._0_4_ = 1;
    }
LAB_006142cb:
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_PackageSource(
  std::vector<GlobalTargetInfo>& targets)
{
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if (!packageSourceTargetName) {
    return;
  }

  auto& mf = this->Makefiles[0];
  std::string configFile =
    cmStrCat(mf->GetCurrentBinaryDirectory(), "/CPackSourceConfig.cmake");
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package_source" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target,
                            "when CPack source packaging is enabled")) {
      return;
    }
  }

  GlobalTargetInfo gti;
  gti.Name = packageSourceTargetName;
  gti.Message = "Run CPack packaging tool for source...";
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  singleLine.push_back("--config");
  singleLine.push_back("./CPackSourceConfig.cmake");
  singleLine.push_back(std::move(configFile));
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}